

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_insertArray_success_middleIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x5;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x10ff01;
  local_20 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  builtin_strncpy(local_20,"0156",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x10ff39;
  bVar1 = private_ACUtils_ADynArray_insertArray(&local_48,2,"234",3,1);
  if (bVar1 == true) {
    uStack_50 = 0x10ff53;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x30f);
    if (local_30 == (char *)0x8) {
      uStack_50 = 0x10ff73;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x310);
      if (local_28 == (char *)0x8) {
        uStack_50 = 0x10ff93;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x311);
        if (local_20 == (char *)0x0) {
          ppcVar6 = &local_58;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar7 = "(void*) array.buffer != NULL";
          pcVar8 = "(void*) array.buffer";
          iVar2 = 0x312;
LAB_001101f9:
          uStack_50 = 0;
          local_58 = (char *)0x0;
          *(code **)((long)ppcVar6 + -8) = test_ADynArray_insertArray_success_endIndex_fn;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,pcVar4,pcVar3,pcVar7,pcVar8);
        }
        uStack_50 = 0x10ffb0;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x312);
        pcStack_80 = local_20;
        if (local_20 == (char *)0x0) {
          pcVar3 = "";
          pcStack_80 = "(null)";
        }
        else {
          uStack_50 = 0x10ffcd;
          iVar2 = strcmp("0123456",local_20);
          if (iVar2 == 0) {
            uStack_50 = 0x10ffe6;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x313);
            if (local_38 == (code *)0x0) {
              ppcVar6 = &local_58;
              pcVar4 = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar7 = "(void*) array.growStrategy != NULL";
              pcVar8 = "(void*) array.growStrategy";
              iVar2 = 0x314;
            }
            else {
              uStack_50 = 0x110003;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x314);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                uStack_50 = 0x110024;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x315);
                uStack_50 = 0x11002d;
                (*pcStack_40)(local_20);
                return;
              }
              ppcVar6 = &local_68;
              local_60 = "0";
              local_68 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
              pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount";
              iVar2 = 0x315;
            }
            goto LAB_001101f9;
          }
          pcVar3 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar4 = "array.buffer == \"0123456\"";
        pcVar7 = "array.buffer";
        iVar2 = 0x313;
        local_58 = "\"";
        local_60 = "0123456";
        local_68 = "\"";
        pcStack_70 = "\"0123456\"";
        ppcVar5 = &pcStack_80;
        pcStack_78 = pcVar3;
        goto LAB_00110179;
      }
      pcVar4 = "array.capacity == 8";
      pcVar7 = "array.capacity";
      iVar2 = 0x311;
      pcVar3 = local_28;
    }
    else {
      pcVar4 = "array.size == 8";
      pcVar7 = "array.size";
      iVar2 = 0x310;
      pcVar3 = local_30;
    }
    local_60 = "8";
    local_58 = (char *)0x8;
  }
  else {
    pcVar3 = (char *)(ulong)bVar1;
    local_60 = "true";
    pcVar4 = 
    "private_ACUtils_ADynArray_insertArray(&array, 2, \"234\", 3, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar7 = 
    "private_ACUtils_ADynArray_insertArray(&array, 2, \"234\", 3, sizeof(*(&array)->buffer))";
    iVar2 = 0x30f;
    local_58 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar5 = &local_60;
LAB_00110179:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x110180;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar8,pcVar4,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insertArray_success_middleIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "0156", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertArray(&array, 2, "234", 3), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}